

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputPFBDecodeStream.cpp
# Opt level: O2

void __thiscall InputPFBDecodeStream::SkipTillToken(InputPFBDecodeStream *this)

{
  Byte BVar1;
  bool bVar2;
  int iVar3;
  EStatusCode EVar4;
  InputPFBDecodeStream *this_00;
  Byte buffer;
  Byte local_19;
  
  local_19 = '\0';
  if ((this->mInternalState == eSuccess) &&
     (iVar3 = (*(this->super_IByteReader)._vptr_IByteReader[3])(), (char)iVar3 != '\0')) {
    do {
      bVar2 = IsSegmentNotEnded(this);
      if (!bVar2) {
        return;
      }
      this_00 = this;
      EVar4 = GetNextByteForToken(this,&local_19);
      BVar1 = local_19;
      if (EVar4 != eSuccess) {
        return;
      }
      bVar2 = IsPostScriptWhiteSpace(this_00,local_19);
    } while (bVar2);
    this->mHasTokenBuffer = true;
    this->mTokenBuffer = BVar1;
  }
  return;
}

Assistant:

void InputPFBDecodeStream::SkipTillToken()
{
	Byte buffer = 0;

	if(mInternalState != PDFHummus::eSuccess || !NotEnded())
		return;

	// skip till hitting first non space, or segment end
	while(IsSegmentNotEnded())
	{
		if(GetNextByteForToken(buffer) != PDFHummus::eSuccess)
			break;

		if(!IsPostScriptWhiteSpace(buffer))
		{
			SaveTokenBuffer(buffer);
			break;
		}
	}
}